

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_custom_type_2>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_custom_type_2>_>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  slot_type *psVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ctrl_t *pcVar8;
  slot_type *psVar9;
  slot_type *psVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  long lVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 uVar42;
  undefined1 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  uint32_t uVar49;
  undefined4 uVar50;
  uint32_t uVar51;
  undefined4 uVar52;
  ctrl_t *pcVar53;
  size_t i;
  ulong uVar54;
  ulong uVar55;
  size_t i_00;
  byte bVar56;
  FindInfo FVar57;
  type raw;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  
  uVar7 = this->capacity_;
  if ((uVar7 == 0) || ((uVar7 + 1 & uVar7) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int, custom_type_2>, phmap::Hash<int32_t>, phmap::EqualTo<int>, std::allocator<std::pair<const int, custom_type_2>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<int, custom_type_2>, Hash = phmap::Hash<int32_t>, Eq = phmap::EqualTo<int>, Alloc = std::allocator<std::pair<const int, custom_type_2>>]"
                 );
  }
  if (uVar7 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int, custom_type_2>, phmap::Hash<int32_t>, phmap::EqualTo<int>, std::allocator<std::pair<const int, custom_type_2>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<int, custom_type_2>, Hash = phmap::Hash<int32_t>, Eq = phmap::EqualTo<int>, Alloc = std::allocator<std::pair<const int, custom_type_2>>]"
                 );
  }
  pcVar8 = this->ctrl_;
  if (pcVar8[uVar7] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x230,
                  "void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *__restrict, size_t)"
                 );
  }
  pcVar53 = pcVar8 + uVar7;
  if (pcVar53 + 1 != pcVar8) {
    uVar55 = 0;
    do {
      pcVar1 = pcVar8 + uVar55;
      cVar14 = pcVar1[1];
      cVar15 = pcVar1[2];
      cVar16 = pcVar1[3];
      cVar17 = pcVar1[4];
      cVar18 = pcVar1[5];
      cVar19 = pcVar1[6];
      cVar20 = pcVar1[7];
      cVar21 = pcVar1[8];
      cVar22 = pcVar1[9];
      cVar23 = pcVar1[10];
      cVar24 = pcVar1[0xb];
      cVar25 = pcVar1[0xc];
      cVar26 = pcVar1[0xd];
      cVar27 = pcVar1[0xe];
      cVar28 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar8 + uVar55);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar23 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar24 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar25 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar26 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar27 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar28 < '\0') & 0x7eU ^ 0xfe;
      uVar55 = uVar55 + 0x10;
    } while (uVar7 + 1 != uVar55);
  }
  uVar11 = *(undefined8 *)(pcVar8 + 8);
  *(undefined8 *)(pcVar53 + 1) = *(undefined8 *)pcVar8;
  *(undefined8 *)(pcVar53 + 9) = uVar11;
  *pcVar53 = -1;
  if (this->capacity_ == 0) {
    i_00 = 0;
  }
  else {
    i_00 = 0;
    do {
      if (this->ctrl_[i_00] == -2) {
        auVar12._8_8_ = 0;
        auVar12._0_8_ = (long)this->slots_[i_00].value.first;
        uVar55 = SUB168(auVar12 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar12 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar57 = find_first_non_full(this,uVar55);
        i = FVar57.offset;
        uVar7 = this->capacity_;
        if ((uVar7 + 1 & uVar7) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar54 = uVar55 >> 7 & uVar7;
        bVar56 = (byte)uVar55;
        if (((i_00 - uVar54 ^ i - uVar54) & uVar7) < 0x10) {
          bVar56 = bVar56 & 0x7f;
        }
        else {
          if (this->ctrl_[i] == -2) {
            set_ctrl(this,i,bVar56 & 0x7f);
            psVar10 = this->slots_;
            uVar11 = *(undefined8 *)((long)psVar10 + i_00 * 0x28 + 0x20);
            psVar3 = psVar10 + i_00;
            uVar44 = *(undefined8 *)psVar3;
            uVar51 = ((custom_type_2 *)((long)psVar3 + 8))->three;
            uVar52 = *(undefined4 *)&((custom_type_2 *)((long)psVar3 + 8))->field_0x4;
            puVar6 = (undefined8 *)((long)psVar10 + i_00 * 0x28 + 0x10);
            uVar45 = *puVar6;
            uVar46 = puVar6[1];
            lVar13 = i * 0x28;
            psVar3 = psVar10 + i;
            uVar49 = ((custom_type_2 *)((long)psVar3 + 8))->three;
            uVar50 = *(undefined4 *)&((custom_type_2 *)((long)psVar3 + 8))->field_0x4;
            puVar6 = (undefined8 *)((long)psVar10 + lVar13 + 0x10);
            uVar47 = *puVar6;
            uVar48 = puVar6[1];
            psVar9 = psVar10 + i_00;
            *(undefined8 *)psVar9 = *(undefined8 *)psVar3;
            ((custom_type_2 *)((long)psVar9 + 8))->three = uVar49;
            *(undefined4 *)&((custom_type_2 *)((long)psVar9 + 8))->field_0x4 = uVar50;
            puVar6 = (undefined8 *)((long)psVar10 + i_00 * 0x28 + 0x10);
            *puVar6 = uVar47;
            puVar6[1] = uVar48;
            *(undefined8 *)((long)psVar10 + i_00 * 0x28 + 0x20) =
                 *(undefined8 *)((long)psVar10 + lVar13 + 0x20);
            psVar9 = this->slots_;
            local_48 = (undefined1)uVar45;
            uStack_47 = (undefined1)((ulong)uVar45 >> 8);
            uStack_46 = (undefined1)((ulong)uVar45 >> 0x10);
            uStack_45 = (undefined1)((ulong)uVar45 >> 0x18);
            uStack_44 = (undefined1)((ulong)uVar45 >> 0x20);
            uStack_43 = (undefined1)((ulong)uVar45 >> 0x28);
            uStack_42 = (undefined1)((ulong)uVar45 >> 0x30);
            uStack_41 = (undefined1)((ulong)uVar45 >> 0x38);
            uStack_40 = (undefined1)uVar46;
            uStack_3f = (undefined1)((ulong)uVar46 >> 8);
            uStack_3e = (undefined1)((ulong)uVar46 >> 0x10);
            uStack_3d = (undefined1)((ulong)uVar46 >> 0x18);
            uStack_3c = (undefined1)((ulong)uVar46 >> 0x20);
            uStack_3b = (undefined1)((ulong)uVar46 >> 0x28);
            uStack_3a = (undefined1)((ulong)uVar46 >> 0x30);
            uStack_39 = (undefined1)((ulong)uVar46 >> 0x38);
            psVar3 = psVar9 + i;
            *(undefined8 *)psVar3 = uVar44;
            ((custom_type_2 *)((long)psVar3 + 8))->three = uVar51;
            *(undefined4 *)&((custom_type_2 *)((long)psVar3 + 8))->field_0x4 = uVar52;
            *(undefined8 *)((long)psVar9 + lVar13 + 0x20) = uVar11;
            puVar4 = (undefined1 *)((long)psVar9 + lVar13 + 0x10);
            *puVar4 = local_48;
            puVar4[1] = uStack_47;
            puVar4[2] = uStack_46;
            puVar4[3] = uStack_45;
            puVar4[4] = uStack_44;
            puVar4[5] = uStack_43;
            puVar4[6] = uStack_42;
            puVar4[7] = uStack_41;
            puVar4[8] = uStack_40;
            puVar4[9] = uStack_3f;
            puVar4[10] = uStack_3e;
            puVar4[0xb] = uStack_3d;
            puVar4[0xc] = uStack_3c;
            puVar4[0xd] = uStack_3b;
            puVar4[0xe] = uStack_3a;
            puVar4[0xf] = uStack_39;
            i_00 = i_00 - 1;
            goto LAB_0010386d;
          }
          if (this->ctrl_[i] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x853,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int, custom_type_2>, phmap::Hash<int32_t>, phmap::EqualTo<int>, std::allocator<std::pair<const int, custom_type_2>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<int, custom_type_2>, Hash = phmap::Hash<int32_t>, Eq = phmap::EqualTo<int>, Alloc = std::allocator<std::pair<const int, custom_type_2>>]"
                         );
          }
          set_ctrl(this,i,bVar56 & 0x7f);
          psVar9 = this->slots_;
          *(undefined8 *)((long)psVar9 + i * 0x28 + 0x20) =
               *(undefined8 *)((long)psVar9 + i_00 * 0x28 + 0x20);
          psVar3 = psVar9 + i_00;
          uVar11 = *(undefined8 *)psVar3;
          uVar49 = ((custom_type_2 *)((long)psVar3 + 8))->three;
          uVar50 = *(undefined4 *)&((custom_type_2 *)((long)psVar3 + 8))->field_0x4;
          puVar4 = (undefined1 *)((long)psVar9 + i_00 * 0x28 + 0x10);
          uVar29 = puVar4[1];
          uVar30 = puVar4[2];
          uVar31 = puVar4[3];
          uVar32 = puVar4[4];
          uVar33 = puVar4[5];
          uVar34 = puVar4[6];
          uVar35 = puVar4[7];
          uVar36 = puVar4[8];
          uVar37 = puVar4[9];
          uVar38 = puVar4[10];
          uVar39 = puVar4[0xb];
          uVar40 = puVar4[0xc];
          uVar41 = puVar4[0xd];
          uVar42 = puVar4[0xe];
          uVar43 = puVar4[0xf];
          puVar5 = (undefined1 *)((long)psVar9 + i * 0x28 + 0x10);
          *puVar5 = *puVar4;
          puVar5[1] = uVar29;
          puVar5[2] = uVar30;
          puVar5[3] = uVar31;
          puVar5[4] = uVar32;
          puVar5[5] = uVar33;
          puVar5[6] = uVar34;
          puVar5[7] = uVar35;
          puVar5[8] = uVar36;
          puVar5[9] = uVar37;
          puVar5[10] = uVar38;
          puVar5[0xb] = uVar39;
          puVar5[0xc] = uVar40;
          puVar5[0xd] = uVar41;
          puVar5[0xe] = uVar42;
          puVar5[0xf] = uVar43;
          psVar9 = psVar9 + i;
          *(undefined8 *)psVar9 = uVar11;
          ((custom_type_2 *)((long)psVar9 + 8))->three = uVar49;
          *(undefined4 *)&((custom_type_2 *)((long)psVar9 + 8))->field_0x4 = uVar50;
          bVar56 = 0x80;
        }
        set_ctrl(this,i_00,bVar56);
      }
LAB_0010386d:
      i_00 = i_00 + 1;
    } while (i_00 != this->capacity_);
  }
  reset_growth_left(this,i_00);
  return;
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
                                                 PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hashval);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hashval.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hashval));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hashval));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hashval));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left(capacity_);
    }